

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cc
# Opt level: O2

void __thiscall t_queue::f_push(t_queue *this,t_container *a_library,t_pvalue *a_value)

{
  t_queue<128UL> *ptVar1;
  long *plVar2;
  pthread_rwlock_t *__rwlock;
  anon_class_24_3_6943759f local_30;
  t_container *a_library_local;
  
  local_30.a_library = &a_library_local;
  ptVar1 = (this->super_t_sharable).super_t_owned.v_owner;
  local_30.a_value = a_value;
  local_30.this = this;
  a_library_local = a_library;
  plVar2 = (long *)__tls_get_addr(&PTR_00113e00);
  if (ptVar1 == (t_queue<128UL> *)*plVar2) {
    f_push::anon_class_24_3_6943759f::operator()(&local_30);
  }
  else {
    if (ptVar1 != (t_queue<128UL> *)0x0) {
      xemmai::f_throw(0x18,L"owned by another thread.");
    }
    __rwlock = (pthread_rwlock_t *)
               xemmai::t_lock_with_safe_region<std::shared_mutex>::f_lock
                         (&(this->super_t_sharable).v_mutex);
    if ((this->super_t_sharable).super_t_owned.v_owner != (t_queue<128UL> *)0x0) {
      xemmai::f_throw(0x18,L"owned by another thread.");
    }
    f_push::anon_class_24_3_6943759f::operator()(&local_30);
    pthread_rwlock_unlock(__rwlock);
  }
  return;
}

Assistant:

void t_queue::f_push(t_container* a_library, const t_pvalue& a_value)
{
	f_owned_or_shared<t_lock_with_safe_region>([&]
	{
		auto pair = t_type_of<t_pair>::f_instantiate(a_library, a_value);
		if (v_head) {
			pair->f_as<t_pair>().v_next = v_head->f_as<t_pair>().v_next;
			v_head->f_as<t_pair>().v_next = pair;
		} else {
			pair->f_as<t_pair>().v_next = pair;
		}
		v_head = pair;
	});
}